

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  AABBNodeMB4D *node1;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong in_R8;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  InstancePrimitive *prim;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  RayHit *local_1000;
  RayQueryContext *local_ff8;
  long local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar16 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar71 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar75 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar57 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar25._0_4_ = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar58 = 0.0;
    if (0.0 <= auVar25._0_4_) {
      fVar58 = auVar25._0_4_;
    }
    auVar25._0_4_ = (ray->super_RayK<1>).tfar;
    auVar39 = ZEXT416((uint)auVar25._0_4_);
    fVar34 = 0.0;
    if (0.0 <= auVar25._0_4_) {
      fVar34 = auVar25._0_4_;
    }
    auVar42._4_4_ = -(uint)(ABS(aVar3.y) < DAT_01f80d30._4_4_);
    auVar42._0_4_ = -(uint)(ABS(aVar3.x) < (float)DAT_01f80d30);
    auVar42._8_4_ = -(uint)(ABS(aVar3.z) < DAT_01f80d30._8_4_);
    auVar42._12_4_ = -(uint)(ABS(aVar3.field_3.w) < DAT_01f80d30._12_4_);
    auVar41 = blendvps((undefined1  [16])aVar3,_DAT_01f80d30,auVar42);
    auVar25 = rcpps(auVar42,auVar41);
    fVar62 = auVar25._0_4_;
    fVar64 = auVar25._4_4_;
    fVar66 = auVar25._8_4_;
    fVar62 = (1.0 - auVar41._0_4_ * fVar62) * fVar62 + fVar62;
    fVar64 = (1.0 - auVar41._4_4_ * fVar64) * fVar64 + fVar64;
    fVar66 = (1.0 - auVar41._8_4_ * fVar66) * fVar66 + fVar66;
    uVar21 = (ulong)(fVar62 < 0.0) << 4;
    uVar22 = (ulong)(fVar64 < 0.0) << 4 | 0x20;
    uVar18 = (ulong)(fVar66 < 0.0) << 4 | 0x40;
    uVar24 = uVar21 ^ 0x10;
    uVar19 = uVar22 ^ 0x10;
    local_ff8 = context;
    local_1000 = ray;
    local_f88 = fVar57;
    fStack_f84 = fVar57;
    fStack_f80 = fVar57;
    fStack_f7c = fVar57;
    local_f98 = fVar58;
    fStack_f94 = fVar58;
    fStack_f90 = fVar58;
    fStack_f8c = fVar58;
    local_fa8 = fVar66;
    fStack_fa4 = fVar66;
    fStack_fa0 = fVar66;
    fStack_f9c = fVar66;
    local_fb8 = fVar71;
    fStack_fb4 = fVar71;
    fStack_fb0 = fVar71;
    fStack_fac = fVar71;
    local_fc8 = fVar75;
    fStack_fc4 = fVar75;
    fStack_fc0 = fVar75;
    fStack_fbc = fVar75;
    local_fd8 = fVar62;
    fStack_fd4 = fVar62;
    fStack_fd0 = fVar62;
    fStack_fcc = fVar62;
    local_fe8 = fVar64;
    fStack_fe4 = fVar64;
    fStack_fe0 = fVar64;
    fStack_fdc = fVar64;
    local_1020 = uVar21;
    local_1028 = uVar22;
    fVar81 = fVar64;
    fVar80 = fVar64;
    fVar79 = fVar64;
    fVar78 = fVar62;
    fVar77 = fVar62;
    fVar76 = fVar62;
    fVar74 = fVar75;
    fVar73 = fVar75;
    fVar72 = fVar75;
    fVar70 = fVar71;
    fVar69 = fVar71;
    fVar68 = fVar71;
    fVar67 = fVar66;
    fVar65 = fVar66;
    fVar63 = fVar66;
    fVar61 = fVar58;
    fVar60 = fVar58;
    fVar59 = fVar58;
    fVar56 = fVar57;
    fVar55 = fVar57;
    fVar54 = fVar57;
    fVar36 = fVar34;
    fVar35 = fVar34;
    auVar25._0_4_ = fVar34;
LAB_00da8613:
    do {
      pauVar15 = pauVar16 + -1;
      pauVar16 = pauVar16 + -1;
      if (*(float *)((long)*pauVar15 + 8) <= auVar39._0_4_) {
        uVar23 = *(ulong *)*pauVar16;
        while ((uVar23 & 8) == 0) {
          fVar13 = (ray->super_RayK<1>).dir.field_0.m128[3];
          fVar14 = (ray->super_RayK<1>).tfar;
          iVar6 = (ray->super_RayK<1>).id;
          uVar17 = uVar23 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar17 + 0x80 + uVar21);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar21);
          auVar50._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar68) * fVar76;
          auVar50._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar69) * fVar77;
          auVar50._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar70) * fVar78;
          auVar50._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar71) * fVar62;
          auVar41._4_4_ = fVar60;
          auVar41._0_4_ = fVar59;
          auVar41._8_4_ = fVar61;
          auVar41._12_4_ = fVar58;
          auVar39 = maxps(auVar41,auVar50);
          pfVar2 = (float *)(uVar17 + 0x80 + uVar22);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar22);
          auVar53._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar72) * fVar79;
          auVar53._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar73) * fVar80;
          auVar53._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar74) * fVar81;
          auVar53._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar75) * fVar64;
          pfVar2 = (float *)(uVar17 + 0x80 + uVar18);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar18);
          auVar47._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar54) * fVar63;
          auVar47._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar55) * fVar65;
          auVar47._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar56) * fVar67;
          auVar47._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar57) * fVar66;
          auVar42 = maxps(auVar53,auVar47);
          local_1018 = maxps(auVar39,auVar42);
          pfVar2 = (float *)(uVar17 + 0x80 + uVar24);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar24);
          auVar48._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar68) * fVar76;
          auVar48._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar69) * fVar77;
          auVar48._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar70) * fVar78;
          auVar48._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar71) * fVar62;
          pfVar2 = (float *)(uVar17 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar19);
          auVar51._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar72) * fVar79;
          auVar51._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar73) * fVar80;
          auVar51._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar74) * fVar81;
          auVar51._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar75) * fVar64;
          pfVar2 = (float *)(uVar17 + 0x80 + (uVar18 ^ 0x10));
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar18 ^ 0x10));
          auVar43._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar54) * fVar63;
          auVar43._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar55) * fVar65;
          auVar43._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar56) * fVar67;
          auVar43._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar57) * fVar66;
          auVar42 = minps(auVar51,auVar43);
          auVar44._4_4_ = fVar35;
          auVar44._0_4_ = auVar25._0_4_;
          auVar44._8_4_ = fVar36;
          auVar44._12_4_ = fVar34;
          auVar39 = minps(auVar44,auVar48);
          auVar39 = minps(auVar39,auVar42);
          if (((uint)uVar23 & 7) == 6) {
            bVar9 = (fVar13 < *(float *)(uVar17 + 0xf0) && *(float *)(uVar17 + 0xe0) <= fVar13) &&
                    local_1018._0_4_ <= auVar39._0_4_;
            bVar10 = (fVar13 < *(float *)(uVar17 + 0xf4) && *(float *)(uVar17 + 0xe4) <= fVar13) &&
                     local_1018._4_4_ <= auVar39._4_4_;
            bVar11 = (fVar13 < *(float *)(uVar17 + 0xf8) && *(float *)(uVar17 + 0xe8) <= fVar13) &&
                     local_1018._8_4_ <= auVar39._8_4_;
            bVar12 = (fVar13 < *(float *)(uVar17 + 0xfc) && *(float *)(uVar17 + 0xec) <= fVar13) &&
                     local_1018._12_4_ <= auVar39._12_4_;
          }
          else {
            bVar9 = local_1018._0_4_ <= auVar39._0_4_;
            bVar10 = local_1018._4_4_ <= auVar39._4_4_;
            bVar11 = local_1018._8_4_ <= auVar39._8_4_;
            bVar12 = local_1018._12_4_ <= auVar39._12_4_;
          }
          auVar37._0_4_ = (uint)bVar9 * -0x80000000;
          auVar37._4_4_ = (uint)bVar10 * -0x80000000;
          auVar37._8_4_ = (uint)bVar11 * -0x80000000;
          auVar37._12_4_ = (uint)bVar12 * -0x80000000;
          uVar20 = movmskps((int)in_R8,auVar37);
          in_R8 = (ulong)uVar20;
          if (uVar20 == 0) {
            auVar39._4_4_ = fVar14;
            auVar39._0_4_ = fVar14;
            auVar39._8_4_ = iVar6;
            auVar39._12_4_ = iVar6;
            if (pauVar16 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00da8613;
          }
          lVar8 = 0;
          if ((byte)uVar20 != 0) {
            for (; ((byte)uVar20 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar23 = *(ulong *)(uVar17 + lVar8 * 8);
          uVar20 = (uVar20 & 0xff) - 1 & uVar20 & 0xff;
          in_R8 = (ulong)uVar20;
          if (uVar20 != 0) {
            uVar4 = *(uint *)(local_1018 + lVar8 * 4);
            lVar8 = 0;
            if (in_R8 != 0) {
              for (; (uVar20 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar17 + lVar8 * 8);
            uVar5 = *(uint *)(local_1018 + lVar8 * 4);
            uVar20 = uVar20 - 1 & uVar20;
            uVar21 = local_1020;
            uVar22 = local_1028;
            if (uVar20 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar16 = uVar7;
                *(uint *)((long)*pauVar16 + 8) = uVar5;
                pauVar16 = pauVar16 + 1;
              }
              else {
                *(ulong *)*pauVar16 = uVar23;
                *(uint *)((long)*pauVar16 + 8) = uVar4;
                pauVar16 = pauVar16 + 1;
                uVar23 = uVar7;
              }
            }
            else {
              auVar38._8_4_ = uVar4;
              auVar38._0_8_ = uVar23;
              auVar38._12_4_ = 0;
              auVar45._8_4_ = uVar5;
              auVar45._0_8_ = uVar7;
              auVar45._12_4_ = 0;
              lVar8 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              in_R8 = *(ulong *)(uVar17 + lVar8 * 8);
              iVar6 = *(int *)(local_1018 + lVar8 * 4);
              auVar40._8_4_ = iVar6;
              auVar40._0_8_ = in_R8;
              auVar40._12_4_ = 0;
              auVar26._8_4_ = -(uint)((int)uVar4 < (int)uVar5);
              uVar20 = uVar20 - 1 & uVar20;
              if (uVar20 == 0) {
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar49._8_4_ = uVar5;
                auVar49._0_8_ = uVar7;
                auVar49._12_4_ = 0;
                auVar42 = blendvps(auVar49,auVar38,auVar26);
                auVar39 = blendvps(auVar38,auVar45,auVar26);
                auVar27._8_4_ = -(uint)(auVar42._8_4_ < iVar6);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                auVar46._8_4_ = iVar6;
                auVar46._0_8_ = in_R8;
                auVar46._12_4_ = 0;
                auVar41 = blendvps(auVar46,auVar42,auVar27);
                auVar50 = blendvps(auVar42,auVar40,auVar27);
                auVar28._8_4_ = -(uint)(auVar39._8_4_ < auVar50._8_4_);
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                auVar42 = blendvps(auVar50,auVar39,auVar28);
                auVar39 = blendvps(auVar39,auVar50,auVar28);
                *pauVar16 = auVar39;
                pauVar16[1] = auVar42;
                uVar23 = auVar41._0_8_;
                pauVar16 = pauVar16 + 2;
              }
              else {
                lVar8 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                auVar29._4_4_ = auVar26._8_4_;
                auVar29._0_4_ = auVar26._8_4_;
                auVar29._8_4_ = auVar26._8_4_;
                auVar29._12_4_ = auVar26._8_4_;
                auVar50 = blendvps(auVar45,auVar38,auVar29);
                auVar39 = blendvps(auVar38,auVar45,auVar29);
                auVar52._8_4_ = *(int *)(local_1018 + lVar8 * 4);
                auVar52._0_8_ = *(undefined8 *)(uVar17 + lVar8 * 8);
                auVar52._12_4_ = 0;
                auVar30._8_4_ = -(uint)(iVar6 < *(int *)(local_1018 + lVar8 * 4));
                auVar30._4_4_ = auVar30._8_4_;
                auVar30._0_4_ = auVar30._8_4_;
                auVar30._12_4_ = auVar30._8_4_;
                auVar41 = blendvps(auVar52,auVar40,auVar30);
                auVar42 = blendvps(auVar40,auVar52,auVar30);
                auVar31._8_4_ = -(uint)(auVar39._8_4_ < auVar42._8_4_);
                auVar31._4_4_ = auVar31._8_4_;
                auVar31._0_4_ = auVar31._8_4_;
                auVar31._12_4_ = auVar31._8_4_;
                auVar53 = blendvps(auVar42,auVar39,auVar31);
                auVar39 = blendvps(auVar39,auVar42,auVar31);
                auVar32._8_4_ = -(uint)(auVar50._8_4_ < auVar41._8_4_);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                auVar42 = blendvps(auVar41,auVar50,auVar32);
                auVar50 = blendvps(auVar50,auVar41,auVar32);
                auVar33._8_4_ = -(uint)(auVar50._8_4_ < auVar53._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar41 = blendvps(auVar53,auVar50,auVar33);
                auVar50 = blendvps(auVar50,auVar53,auVar33);
                *pauVar16 = auVar39;
                pauVar16[1] = auVar50;
                pauVar16[2] = auVar41;
                uVar23 = auVar42._0_8_;
                pauVar16 = pauVar16 + 3;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)uVar23 & 0xf) - 8;
        if (local_ff0 != 0) {
          prim = (InstancePrimitive *)(uVar23 & 0xfffffffffffffff0);
          do {
            InstanceIntersector1MB::intersect(&local_1029,ray,context,prim);
            prim = prim + 1;
            local_ff0 = local_ff0 + -1;
            context = local_ff8;
            ray = local_1000;
          } while (local_ff0 != 0);
        }
        auVar25._0_4_ = (ray->super_RayK<1>).tfar;
        auVar25._4_4_ = (ray->super_RayK<1>).mask;
        auVar25._8_4_ = (ray->super_RayK<1>).id;
        auVar25._12_4_ = (ray->super_RayK<1>).flags;
        uVar21 = local_1020;
        uVar22 = local_1028;
        fVar35 = auVar25._0_4_;
        fVar36 = auVar25._0_4_;
        fVar34 = auVar25._0_4_;
        auVar39 = auVar25;
        fVar54 = local_f88;
        fVar55 = fStack_f84;
        fVar56 = fStack_f80;
        fVar57 = fStack_f7c;
        fVar59 = local_f98;
        fVar60 = fStack_f94;
        fVar61 = fStack_f90;
        fVar58 = fStack_f8c;
        fVar63 = local_fa8;
        fVar65 = fStack_fa4;
        fVar67 = fStack_fa0;
        fVar66 = fStack_f9c;
        fVar68 = local_fb8;
        fVar69 = fStack_fb4;
        fVar70 = fStack_fb0;
        fVar71 = fStack_fac;
        fVar72 = local_fc8;
        fVar73 = fStack_fc4;
        fVar74 = fStack_fc0;
        fVar75 = fStack_fbc;
        fVar76 = local_fd8;
        fVar77 = fStack_fd4;
        fVar78 = fStack_fd0;
        fVar62 = fStack_fcc;
        fVar79 = local_fe8;
        fVar80 = fStack_fe4;
        fVar81 = fStack_fe0;
        fVar64 = fStack_fdc;
      }
    } while (pauVar16 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }